

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void cmGlobalNinjaGenerator::Indent(ostream *os,int count)

{
  char *pcVar1;
  size_t sVar2;
  
  if (0 < count) {
    do {
      pcVar1 = INDENT;
      if (INDENT == (char *)0x0) {
        std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
      }
      else {
        sVar2 = strlen(INDENT);
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar2);
      }
      count = count + -1;
    } while (count != 0);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::Indent(std::ostream& os, int count)
{
  for (int i = 0; i < count; ++i) {
    os << cmGlobalNinjaGenerator::INDENT;
  }
}